

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasso_path_extraction.hh
# Opt level: O3

vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
* __thiscall
tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::
blue_dfs(vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
         *__return_storage_ptr__,
        lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t> *this,graph_t *g
        ,node_sptr_t *n,
        function<bool_(const_tchecker::tck_liveness::zg_ndfs::graph_t_&,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>)>
        *filter_final,
        function<bool_(const_tchecker::tck_liveness::zg_ndfs::graph_t_&,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>)>
        *filter_edge,
        unordered_set<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::hash<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_std::equal_to<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
        *cyan,unordered_set<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::hash<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_std::equal_to<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
              *blue,
        unordered_set<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::hash<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_std::equal_to<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
        *red)

{
  ndfs_entry_t *this_00;
  make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
  *pmVar1;
  long lVar2;
  __hashtable_alloc *p_Var3;
  pointer piVar4;
  _Any_data *p_Var5;
  bool bVar6;
  _Elt_pointer pnVar7;
  flags_t *pfVar8;
  iterator iVar9;
  overflow_error *poVar10;
  make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
  *pmVar11;
  __node_gen_type _Var12;
  edge_sptr_t *this_01;
  edge_sptr_t e;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  local_f0;
  edge_sptr_t edge;
  __node_gen_type __node_gen;
  outgoing_edges_iterator_t local_d8;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  local_d0;
  vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
  *local_c8;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  local_c0;
  node_sptr_t next;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  local_b0;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  *local_a8;
  lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t> *local_a0;
  _Any_data *local_98;
  _Any_data *local_90;
  stack<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t,_std::deque<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t>_>_>
  stack;
  
  stack.c.
  super__Deque_base<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  stack.c.
  super__Deque_base<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  stack.c.
  super__Deque_base<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  stack.c.
  super__Deque_base<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  stack.c.
  super__Deque_base<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  stack.c.
  super__Deque_base<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  stack.c.
  super__Deque_base<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  stack.c.
  super__Deque_base<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  stack.c.
  super__Deque_base<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  stack.c.
  super__Deque_base<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_a0 = this;
  local_90 = (_Any_data *)filter_final;
  std::
  _Deque_base<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t>_>
  ::_M_initialize_map((_Deque_base<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t>_>
                       *)&stack,0);
  (__return_storage_ptr__->
  super__Vector_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8 = (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
              *)&(g->
                 super_graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>
                 ).field_0x50;
  local_c8 = __return_storage_ptr__;
  graph::directed::
  graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
  ::edges<tchecker::graph::directed::details::outgoing>
            ((graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
              *)&e,local_a8);
  ndfs_entry_t::ndfs_entry_t
            ((ndfs_entry_t *)&__node_gen,n,
             (range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
              *)&e);
  std::
  deque<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t>_>
  ::
  emplace_back<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t>
            (&stack.c,(ndfs_entry_t *)&__node_gen);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_d0);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_d8._edge);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t
            ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
              *)&__node_gen);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_f0);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&e);
  __node_gen._M_h = (__hashtable_alloc *)cyan;
  std::
  _Hashtable<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>,std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>>,std::__detail::_Identity,std::equal_to<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>>,std::hash<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>,true>>>>
            ((_Hashtable<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>,std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>>,std::__detail::_Identity,std::equal_to<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>>,std::hash<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)cyan,n,&__node_gen);
  p_Var5 = (_Any_data *)filter_edge;
  if (stack.c.
      super__Deque_base<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      stack.c.
      super__Deque_base<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      local_98 = p_Var5;
      pnVar7 = stack.c.
               super__Deque_base<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (stack.c.
          super__Deque_base<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          stack.c.
          super__Deque_base<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pnVar7 = stack.c.
                 super__Deque_base<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
      }
      this_00 = pnVar7 + -1;
      pmVar11 = pnVar7[-1]._current_edge._edge._t;
      if (pmVar11 == pnVar7[-1]._end_edge._edge._t) {
        local_c0._t = (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                       *)0x0;
        pmVar1 = (this_00->_n)._t;
        if ((pmVar1 != (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                        *)0x0) &&
           (pmVar11 = (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                       *)((long)&((pmVar1[-1].
                                   super_node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
                                   .
                                   super_node_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
                                   .
                                   super_edge_list_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
                                   ._head._t)->
                                 super_edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
                                 ).super_edge_t.super_edge_vedge_t._vedge._t + 1),
           pmVar1[-1].
           super_node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
           .
           super_node_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
           .
           super_edge_list_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
           ._head._t = pmVar11,
           pmVar11 ==
           (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
            *)0xfffffffffffffffe)) {
          poVar10 = (overflow_error *)__cxa_allocate_exception(0x10);
          std::overflow_error::overflow_error(poVar10,"reference counter overflow");
          __cxa_throw(poVar10,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
        }
        local_c0._t = pmVar1;
        if (*(long *)(local_90 + 1) == 0) {
          std::__throw_bad_function_call();
        }
        bVar6 = (**(code **)(local_90->_M_pod_data + 0x18))(local_90,g,&local_c0);
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
        ::~intrusive_shared_ptr_t(&local_c0);
        if (bVar6) {
          e._t = (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                  *)0x0;
          pmVar11 = (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                     *)(this_00->_n)._t;
          if ((pmVar11 !=
               (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                *)0x0) &&
             (lVar2 = *(long *)((edge_list_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
                                 *)(pmVar11 + -1) + 4),
             ((edge_list_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
               *)(pmVar11 + -1))[4] =
                  (edge_list_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
                   )(lVar2 + 1), lVar2 + 1 == -2)) {
            poVar10 = (overflow_error *)__cxa_allocate_exception(0x10);
            std::overflow_error::overflow_error(poVar10,"reference counter overflow");
            __cxa_throw(poVar10,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error)
            ;
          }
          e._t = pmVar11;
          red_dfs((vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
                   *)&__node_gen,local_a0,g,(node_sptr_t *)&e,filter_edge,cyan,blue,red);
          intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
          ::~intrusive_shared_ptr_t
                    ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                      *)&e);
          _Var12 = __node_gen;
          if ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
               )__node_gen._M_h != local_d8._edge._t) goto LAB_00132b0d;
          std::
          vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
          ::~vector((vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
                     *)&__node_gen);
          __return_storage_ptr__ = local_c8;
        }
        e._t = (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                *)0x0;
        pmVar11 = (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                   *)(this_00->_n)._t;
        if ((pmVar11 !=
             (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
              *)0x0) &&
           (lVar2 = *(long *)((edge_list_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
                               *)(pmVar11 + -1) + 4),
           ((edge_list_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
             *)(pmVar11 + -1))[4] =
                (edge_list_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
                 )(lVar2 + 1), lVar2 + 1 == -2)) {
          poVar10 = (overflow_error *)__cxa_allocate_exception(0x10);
          std::overflow_error::overflow_error(poVar10,"reference counter overflow");
          __cxa_throw(poVar10,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
        }
        __node_gen._M_h = (__hashtable_alloc *)blue;
        e._t = pmVar11;
        std::
        _Hashtable<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>,std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>>,std::__detail::_Identity,std::equal_to<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>>,std::hash<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>,true>>>>
                  ((_Hashtable<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>,std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>>,std::__detail::_Identity,std::equal_to<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>>,std::hash<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)blue,&e,
                   (vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
                    *)&__node_gen);
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
        ::~intrusive_shared_ptr_t
                  ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                    *)&e);
        __node_gen._M_h = (__hashtable_alloc *)0x0;
        p_Var3 = (__hashtable_alloc *)(this_00->_n)._t;
        if ((p_Var3 != (__hashtable_alloc *)0x0) &&
           (pmVar11 = (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                       *)((long)&(((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                                    *)&p_Var3[-8].field_0x0)->_t->
                                 super_edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
                                 ).super_edge_t.super_edge_vedge_t._vedge._t + 1),
           ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
             *)&p_Var3[-8].field_0x0)->_t = pmVar11,
           pmVar11 ==
           (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
            *)0xfffffffffffffffe)) {
          poVar10 = (overflow_error *)__cxa_allocate_exception(0x10);
          std::overflow_error::overflow_error(poVar10,"reference counter overflow");
          __cxa_throw(poVar10,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
        }
        __node_gen._M_h = p_Var3;
        std::
        _Hashtable<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_std::__detail::_Identity,_std::equal_to<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_std::hash<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::_M_erase(&cyan->_M_h,&__node_gen);
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
        ::~intrusive_shared_ptr_t
                  ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                    *)&__node_gen);
        std::
        deque<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t>_>
        ::pop_back(&stack.c);
        piVar4 = (__return_storage_ptr__->
                 super__Vector_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if ((__return_storage_ptr__->
            super__Vector_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start != piVar4) {
          this_01 = piVar4 + -1;
          (__return_storage_ptr__->
          super__Vector_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = this_01;
          goto LAB_00132ac3;
        }
      }
      else {
        edge._t = (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                   *)0x0;
        if ((pmVar11 !=
             (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
              *)0x0) &&
           (pfVar8 = &((pmVar11[-1].
                        super_edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
                        .
                        super_edge_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
                        .
                        super_edge_node_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
                        ._node._t)->
                      super_node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
                      ).super_node_t.super_node_t.super_node_flags_t.NODE_FINAL,
           pmVar11[-1].
           super_edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
           .
           super_edge_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
           .
           super_edge_node_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
           ._node._t = (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                        *)pfVar8, pfVar8 == (flags_t *)0xfffffffffffffffe)) {
          poVar10 = (overflow_error *)__cxa_allocate_exception(0x10);
          std::overflow_error::overflow_error(poVar10,"reference counter overflow");
          __cxa_throw(poVar10,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
        }
        edge._t = pmVar11;
        ndfs_entry_t::next(this_00);
        local_b0._t = (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                       *)0x0;
        if ((edge._t !=
             (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
              *)0x0) &&
           (pfVar8 = &((edge._t[-1].
                        super_edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
                        .
                        super_edge_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
                        .
                        super_edge_node_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
                        ._node._t)->
                      super_node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
                      ).super_node_t.super_node_t.super_node_flags_t.NODE_FINAL,
           edge._t[-1].
           super_edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
           .
           super_edge_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
           .
           super_edge_node_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
           ._node._t = (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                        *)pfVar8, pfVar8 == (flags_t *)0xfffffffffffffffe)) {
          poVar10 = (overflow_error *)__cxa_allocate_exception(0x10);
          std::overflow_error::overflow_error(poVar10,"reference counter overflow");
          __cxa_throw(poVar10,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
        }
        local_b0._t = edge._t;
        if (*(long *)((long)filter_edge + 0x10) == 0) {
          std::__throw_bad_function_call();
        }
        bVar6 = (**(code **)((long)filter_edge + 0x18))((_Any_data *)filter_edge,g,&local_b0);
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
        ::~intrusive_shared_ptr_t(&local_b0);
        if (bVar6) {
          if (edge._t ==
              (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
               *)0x0) {
            __assert_fail("_t != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                          ,0x1db,
                          "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t, tchecker::tck_liveness::zg_ndfs::edge_t>>>::operator->() const [T = tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t, tchecker::tck_liveness::zg_ndfs::edge_t>>]"
                         );
          }
          next._t = (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                     *)0x0;
          pmVar1 = ((edge._t)->
                   super_edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
                   ).
                   super_edge_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
                   .
                   super_edge_node_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
                   ._node._t;
          if ((pmVar1 != (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                          *)0x0) &&
             (pmVar11 = (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                         *)((long)&((pmVar1[-1].
                                     super_node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
                                     .
                                     super_node_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
                                     .
                                     super_edge_list_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
                                     ._head._t)->
                                   super_edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
                                   ).super_edge_t.super_edge_vedge_t._vedge._t + 1),
             pmVar1[-1].
             super_node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
             .
             super_node_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
             .
             super_edge_list_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
             ._head._t = pmVar11,
             pmVar11 ==
             (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
              *)0xfffffffffffffffe)) {
            poVar10 = (overflow_error *)__cxa_allocate_exception(0x10);
            std::overflow_error::overflow_error(poVar10,"reference counter overflow");
            __cxa_throw(poVar10,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error)
            ;
          }
          next._t = pmVar1;
          iVar9 = std::
                  _Hashtable<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_std::__detail::_Identity,_std::equal_to<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_std::hash<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find(&cyan->_M_h,&next);
          if ((iVar9.
               super__Node_iterator_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_true>
               ._M_cur == (__node_type *)0x0) &&
             (iVar9 = std::
                      _Hashtable<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_std::__detail::_Identity,_std::equal_to<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_std::hash<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::find(&blue->_M_h,&next),
             iVar9.
             super__Node_iterator_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_true>
             ._M_cur == (__node_type *)0x0)) {
            graph::directed::
            graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
            ::edges<tchecker::graph::directed::details::outgoing>
                      ((graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
                        *)&e,local_a8);
            ndfs_entry_t::ndfs_entry_t
                      ((ndfs_entry_t *)&__node_gen,&next,
                       (range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
                        *)&e);
            std::
            deque<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t>_>
            ::
            emplace_back<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t>
                      (&stack.c,(ndfs_entry_t *)&__node_gen);
            intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
            ::~intrusive_shared_ptr_t(&local_d0);
            intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
            ::~intrusive_shared_ptr_t(&local_d8._edge);
            intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
            ::~intrusive_shared_ptr_t
                      ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                        *)&__node_gen);
            intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
            ::~intrusive_shared_ptr_t(&local_f0);
            intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
            ::~intrusive_shared_ptr_t(&e);
            __node_gen._M_h = (__hashtable_alloc *)cyan;
            std::
            _Hashtable<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>,std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>>,std::__detail::_Identity,std::equal_to<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>>,std::hash<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>,true>>>>
                      ((_Hashtable<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>,std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>>,std::__detail::_Identity,std::equal_to<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>>,std::hash<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)cyan,&next,(ndfs_entry_t *)&__node_gen);
            std::
            vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
            ::push_back(__return_storage_ptr__,&edge);
          }
          intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
          ::~intrusive_shared_ptr_t(&next);
          intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
          ::~intrusive_shared_ptr_t(&edge);
          filter_edge = (function<bool_(const_tchecker::tck_liveness::zg_ndfs::graph_t_&,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>)>
                         *)local_98;
        }
        else {
          this_01 = &edge;
LAB_00132ac3:
          intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
          ::~intrusive_shared_ptr_t(this_01);
        }
      }
      p_Var5 = local_98;
    } while (stack.c.
             super__Deque_base<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             stack.c.
             super__Deque_base<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  if ((__return_storage_ptr__->
      super__Vector_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (__return_storage_ptr__->
      super__Vector_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("edges.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/algorithms/path/lasso_path_extraction.hh"
                  ,0xff,
                  "std::vector<edge_sptr_t> tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::blue_dfs(const GRAPH &, const node_sptr_t &, std::function<bool (const GRAPH &, node_sptr_t)> &&, std::function<bool (const GRAPH &, edge_sptr_t)> &&, std::unordered_set<node_sptr_t> &, std::unordered_set<node_sptr_t> &, std::unordered_set<node_sptr_t> &) [GRAPH = tchecker::tck_liveness::zg_ndfs::graph_t]"
                 );
  }
LAB_00132aeb:
  std::
  deque<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t,_std::allocator<tchecker::algorithms::lasso_path_extraction_algorithm_t<tchecker::tck_liveness::zg_ndfs::graph_t>::ndfs_entry_t>_>
  ::~deque(&stack.c);
  return __return_storage_ptr__;
LAB_00132b0d:
  do {
    e._t = (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
            *)0x0;
    pmVar11 = *(make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                **)_Var12._M_h;
    if ((pmVar11 !=
         (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
          *)0x0) &&
       (pfVar8 = &((pmVar11[-1].
                    super_edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
                    .
                    super_edge_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
                    .
                    super_edge_node_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
                    ._node._t)->
                  super_node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
                  ).super_node_t.super_node_t.super_node_flags_t.NODE_FINAL,
       pmVar11[-1].
       super_edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
       .
       super_edge_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
       .
       super_edge_node_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
       ._node._t = (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                    *)pfVar8, pfVar8 == (flags_t *)0xfffffffffffffffe)) {
      poVar10 = (overflow_error *)__cxa_allocate_exception(0x10);
      std::overflow_error::overflow_error(poVar10,"reference counter overflow");
      __cxa_throw(poVar10,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
    }
    e._t = pmVar11;
    std::
    vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
    ::push_back(local_c8,&e);
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t(&e);
    _Var12._M_h = _Var12._M_h + 8;
  } while ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
            )_Var12._M_h != local_d8._edge._t);
  std::
  vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
  ::~vector((vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
             *)&__node_gen);
  __return_storage_ptr__ = local_c8;
  goto LAB_00132aeb;
}

Assistant:

std::vector<edge_sptr_t> blue_dfs(GRAPH const & g, node_sptr_t const & n,
                                    std::function<bool(GRAPH const &, node_sptr_t)> && filter_final,
                                    std::function<bool(GRAPH const &, edge_sptr_t)> && filter_edge,
                                    std::unordered_set<node_sptr_t> & cyan, std::unordered_set<node_sptr_t> & blue,
                                    std::unordered_set<node_sptr_t> & red)
  {
    std::stack<ndfs_entry_t> stack;
    std::vector<edge_sptr_t> edges;

    stack.push(ndfs_entry_t{n, g.outgoing_edges(n)});
    cyan.insert(n);

    while (!stack.empty()) {
      ndfs_entry_t & entry = stack.top();

      if (!entry.fully_explored()) {
        edge_sptr_t edge = entry.current_edge();
        entry.next();

        if (!filter_edge(g, edge))
          continue;

        node_sptr_t next = g.edge_tgt(edge);
        if ((cyan.find(next) == cyan.end()) && (blue.find(next) == blue.end())) {
          stack.push(ndfs_entry_t{next, g.outgoing_edges(next)});
          cyan.insert(next);
          edges.push_back(edge);
        }
      }
      else {
        if (filter_final(g, entry.node())) {
          std::vector<edge_sptr_t> red_edges = red_dfs(g, entry.node(), std::move(filter_edge), cyan, blue, red);
          if (!red_edges.empty()) { // lasso path found
            for (edge_sptr_t e : red_edges)
              edges.push_back(e);
            return edges;
          }
        }
        blue.insert(entry.node());
        cyan.erase(entry.node());
        stack.pop();
        if (!edges.empty())
          edges.pop_back();
      }
    }

    assert(edges.empty());
    return edges;
  }